

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O3

void __thiscall
p2t::SweepContext::CreateAdvancingFront
          (SweepContext *this,vector<p2t::Node_*,_std::allocator<p2t::Node_*>_> *nodes)

{
  size_t *psVar1;
  Point *pPVar2;
  Triangle *this_00;
  _List_node_base *p_Var3;
  Node *pNVar4;
  Node *pNVar5;
  AdvancingFront *this_01;
  
  this_00 = (Triangle *)operator_new(0x40);
  Triangle::Triangle(this_00,*(this->points_).
                              super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,this->tail_,this->head_);
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->map_).super__List_base<p2t::Triangle_*,_std::allocator<p2t::Triangle_*>_>._M_impl
            ._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  pNVar4 = (Node *)operator_new(0x28);
  pPVar2 = this_00->points_[1];
  pNVar4->point = pPVar2;
  pNVar4->triangle = this_00;
  pNVar4->next = (Node *)0x0;
  pNVar4->prev = (Node *)0x0;
  pNVar4->value = pPVar2->x;
  this->af_head_ = pNVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pPVar2 = this_00->points_[0];
  pNVar5->point = pPVar2;
  pNVar5->triangle = this_00;
  pNVar5->next = (Node *)0x0;
  pNVar5->prev = (Node *)0x0;
  pNVar5->value = pPVar2->x;
  this->af_middle_ = pNVar5;
  pNVar5 = (Node *)operator_new(0x28);
  pPVar2 = this_00->points_[2];
  pNVar5->point = pPVar2;
  pNVar5->triangle = (Triangle *)0x0;
  pNVar5->next = (Node *)0x0;
  pNVar5->prev = (Node *)0x0;
  pNVar5->value = pPVar2->x;
  this->af_tail_ = pNVar5;
  this_01 = (AdvancingFront *)operator_new(0x18);
  AdvancingFront::AdvancingFront(this_01,pNVar4,pNVar5);
  this->front_ = this_01;
  pNVar4 = this->af_middle_;
  this->af_head_->next = pNVar4;
  pNVar4->next = this->af_tail_;
  this->af_middle_->prev = this->af_head_;
  this->af_tail_->prev = this->af_middle_;
  return;
}

Assistant:

void SweepContext::CreateAdvancingFront(const std::vector<Node*>& nodes)
{

  (void) nodes;
  // Initial triangle
  Triangle* triangle = new Triangle(*points_[0], *tail_, *head_);

  map_.push_back(triangle);

  af_head_ = new Node(*triangle->GetPoint(1), *triangle);
  af_middle_ = new Node(*triangle->GetPoint(0), *triangle);
  af_tail_ = new Node(*triangle->GetPoint(2));
  front_ = new AdvancingFront(*af_head_, *af_tail_);

  // TODO: More intuitive if head is middles next and not previous?
  //       so swap head and tail
  af_head_->next = af_middle_;
  af_middle_->next = af_tail_;
  af_middle_->prev = af_head_;
  af_tail_->prev = af_middle_;
}